

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O1

void ihevc_sao_edge_offset_class3
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  UWORD8 UVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  UWORD8 *pUVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong __n;
  byte *pbVar14;
  char cVar15;
  UWORD8 au1_mask [64];
  WORD8 au1_sign_up [64];
  UWORD8 au1_src_left_tmp [64];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 *local_180;
  byte bStack_139;
  uint local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  char local_f8 [64];
  UWORD8 local_b8 [64];
  undefined1 local_78 [72];
  
  lVar4 = (long)wd;
  local_138 = 0xffffffff;
  uStack_134 = 0xffffffff;
  uStack_130 = 0xffffffff;
  uStack_12c = 0xffffffff;
  local_128 = 0xffffffff;
  uStack_124 = 0xffffffff;
  uStack_120 = 0xffffffff;
  uStack_11c = 0xffffffff;
  local_118 = 0xffffffff;
  uStack_114 = 0xffffffff;
  uStack_110 = 0xffffffff;
  uStack_10c = 0xffffffff;
  local_108 = 0xffffffff;
  uStack_104 = 0xffffffff;
  uStack_100 = 0xffffffff;
  uStack_fc = 0xffffffff;
  lVar7 = (long)src_strd;
  if (0 < ht) {
    pUVar5 = pu1_src + (long)wd + -1;
    uVar6 = 0;
    do {
      local_b8[uVar6] = *pUVar5;
      uVar6 = uVar6 + 1;
      pUVar5 = pUVar5 + lVar7;
    } while ((uint)ht != uVar6);
  }
  UVar1 = pu1_src_top[lVar4 + -1];
  uVar6 = lVar4 - 1;
  __n = (ulong)(uint)wd;
  if (0 < wd) {
    memcpy(local_78,pu1_src + (ht + -1) * src_strd,__n);
  }
  bVar2 = pu1_src[uVar6];
  uVar8 = (uint)bVar2;
  if (pu1_avail[5] != '\0') {
    uVar3 = 1;
    if (*pu1_src_top_right <= bVar2) {
      uVar3 = bVar2 == *pu1_src_top_right ^ 3;
    }
    uVar10 = 0xffffffff;
    if (pu1_src[src_strd + -2 + wd] <= bVar2) {
      uVar10 = (uint)(bVar2 != pu1_src[src_strd + -2 + wd]);
    }
    if (uVar10 + uVar3 != 2) {
      uVar3 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar10 + uVar3]] + (uint)bVar2;
      uVar8 = 0xff;
      if (((int)uVar3 < 0x100) && (uVar8 = 0, 0 < (int)uVar3)) {
        uVar8 = uVar3;
      }
    }
  }
  iVar13 = ht + -1;
  bVar2 = pu1_src[iVar13 * src_strd];
  uVar3 = (uint)bVar2;
  if (pu1_avail[6] != '\0') {
    uVar10 = 1;
    if (pu1_src[(iVar13 * src_strd - src_strd) + 1] <= bVar2) {
      uVar10 = bVar2 == pu1_src[(iVar13 * src_strd - src_strd) + 1] ^ 3;
    }
    uVar12 = 0xffffffff;
    if (*pu1_src_bot_left <= bVar2) {
      uVar12 = (uint)(bVar2 != *pu1_src_bot_left);
    }
    if (uVar12 + uVar10 != 2) {
      uVar10 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar12 + uVar10]] + (uint)bVar2;
      uVar3 = 0xff;
      if (((int)uVar10 < 0x100) && (uVar3 = 0, 0 < (int)uVar10)) {
        uVar3 = uVar10;
      }
    }
  }
  if (*pu1_avail == '\0') {
    local_138 = local_138 & 0xffffff00;
  }
  if (pu1_avail[2] == '\0') {
    pUVar5 = pu1_src + lVar7;
    local_180 = pu1_src_left + 1;
    ht = iVar13;
    if (1 < wd) {
      uVar11 = 0;
      do {
        cVar15 = pUVar5[uVar11] != pu1_src[uVar11 + 1];
        if (pUVar5[uVar11] < pu1_src[uVar11 + 1]) {
          cVar15 = -1;
        }
        local_f8[uVar11] = cVar15;
        uVar11 = uVar11 + 1;
      } while ((uVar6 & 0xffffffff) != uVar11);
    }
  }
  else {
    pUVar5 = pu1_src;
    local_180 = pu1_src_left;
    if (1 < wd) {
      uVar11 = 0;
      do {
        cVar15 = pu1_src[uVar11] != pu1_src_top[uVar11 + 1];
        if (pu1_src[uVar11] < pu1_src_top[uVar11 + 1]) {
          cVar15 = -1;
        }
        local_f8[uVar11] = cVar15;
        uVar11 = uVar11 + 1;
      } while ((uVar6 & 0xffffffff) != uVar11);
    }
  }
  if (pu1_avail[1] == '\0') {
    (&bStack_139)[lVar4] = 0;
  }
  uVar10 = ht - (uint)(pu1_avail[3] == '\0');
  if (0 < (int)uVar10) {
    uVar11 = 0;
    do {
      cVar15 = pUVar5[uVar6] != pUVar5[wd - src_strd];
      if (pUVar5[uVar6] < pUVar5[wd - src_strd]) {
        cVar15 = -1;
      }
      local_f8[lVar4 + -1] = cVar15;
      if (0 < wd) {
        uVar9 = 0;
        do {
          bVar2 = pUVar5[uVar9];
          pbVar14 = pUVar5 + uVar9 + lVar7 + -1;
          if (uVar9 == 0) {
            pbVar14 = local_180 + uVar11 + 1;
          }
          uVar12 = (uint)(*pbVar14 < bVar2);
          if (bVar2 < *pbVar14) {
            uVar12 = 0xffffffff;
          }
          if (uVar9 != 0) {
            local_f8[uVar9 - 1] = -(char)uVar12;
          }
          uVar12 = (uint)*(byte *)((long)&local_138 + uVar9) &
                   gi4_ihevc_table_edge_idx[(long)local_f8[uVar9] + (long)(int)uVar12 + 2];
          if (uVar12 != 0) {
            iVar13 = (int)pi1_sao_offset[uVar12] + (uint)bVar2;
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            pUVar5[uVar9] = (UWORD8)iVar13;
          }
          uVar9 = uVar9 + 1;
        } while (__n != uVar9);
      }
      pUVar5 = pUVar5 + lVar7;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar10);
  }
  uVar12 = uVar10;
  if (pu1_avail[2] == '\0') {
    uVar12 = uVar10 + 1;
  }
  pUVar5[(int)(~(uVar12 * src_strd) + wd)] = (UWORD8)uVar8;
  lVar4 = 0;
  if (pu1_avail[3] != '\0') {
    lVar4 = (long)-src_strd;
  }
  pUVar5[lVar4] = (UWORD8)uVar3;
  if (pu1_avail[2] == '\0') {
    uVar10 = uVar10 + 1;
  }
  uVar8 = (uint)(pu1_avail[3] == '\0');
  *pu1_src_top_left = UVar1;
  if (uVar10 + uVar8 != 0 && SCARRY4(uVar10,uVar8) == (int)(uVar10 + uVar8) < 0) {
    memcpy(pu1_src_left,local_b8,(ulong)((uVar10 + uVar8) - 1) + 1);
  }
  if (0 < wd) {
    memcpy(pu1_src_top,local_78,__n);
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class3(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE];
    UWORD8 u1_src_top_left_tmp;
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    UWORD8 *pu1_src_left_cpy;
    WORD8 u1_sign_down;
    WORD32 bit_depth;

    UWORD8 u1_pos_0_ht_tmp;
    UWORD8 u1_pos_wd_0_tmp;

    bit_depth = BIT_DEPTH_LUMA;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    u1_src_top_left_tmp = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* If top-right is available, process separately */
    if(0 != pu1_avail[5])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[wd - 1] - pu1_src_top_right[0]) +
                        SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 - 1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp = CLIP3(pu1_src[wd - 1] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp = pu1_src[wd - 1];
        }
    }
    else
    {
        u1_pos_wd_0_tmp = pu1_src[wd - 1];
    }

    /* If bottom-left is available, process separately */
    if(0 != pu1_avail[6])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src[(ht - 1) * src_strd + 1 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src_bot_left[0]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp = CLIP3(pu1_src[(ht - 1) * src_strd] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp = pu1_src[(ht - 1) * src_strd];
        }
    }
    else
    {
        u1_pos_0_ht_tmp = pu1_src[(ht - 1) * src_strd];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 1;
        for(col = 0; col < wd - 1; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col + 1 - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd - 1; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col + 1]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            au1_sign_up[wd - 1] = SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 + 1 - src_strd]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_down = SIGN(pu1_src[col] - ((col == 0) ? pu1_src_left_cpy[row + 1] :
                                                                 pu1_src[col - 1 + src_strd]));
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                if(col > 0)
                    au1_sign_up[col - 1] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 1] = u1_pos_wd_0_tmp;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0)] = u1_pos_0_ht_tmp;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    *pu1_src_top_left = u1_src_top_left_tmp;
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}